

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O1

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *tinfo,
                 _func_void_ptr_void_ptr *copy_constructor,_func_void_ptr_void_ptr *move_constructor
                 ,void *existing_holder)

{
  byte bVar1;
  handle hVar2;
  instance *this;
  void *pvVar3;
  runtime_error *prVar4;
  long *plVar5;
  undefined8 uVar6;
  long *plVar7;
  handle *this_00;
  PyObject *tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _func_void_ptr_void_ptr *local_90;
  undefined1 local_88 [8];
  string type_name;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  handle local_40;
  object inst;
  
  if (tinfo == (type_info *)0x0) {
    return (handle)(PyObject *)0x0;
  }
  if (_src == (void *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    this_00 = (handle *)local_88;
    hVar2.m_ptr = (PyObject *)&_Py_NoneStruct;
    goto LAB_002645b8;
  }
  local_90 = move_constructor;
  type_name.field_2._8_8_ = copy_constructor;
  hVar2 = find_registered_python_instance(_src,tinfo);
  if (hVar2.m_ptr != (PyObject *)0x0) {
    return (handle)hVar2.m_ptr;
  }
  this = (instance *)(*tinfo->type->tp_alloc)(tinfo->type,0);
  instance::allocate_layout(this);
  this->field_0x30 = this->field_0x30 & 0xfe;
  local_40.m_ptr = (PyObject *)this;
  all_type_info((this->ob_base).ob_type);
  inst.super_handle.m_ptr = (handle)&this->field_1;
  if ((this->field_0x30 & 2) == 0) {
    inst.super_handle.m_ptr =
         (handle)((nonsimple_values_and_holders *)inst.super_handle.m_ptr)->values_and_holders;
  }
  switch(policy) {
  case automatic:
  case take_ownership:
    ((PyObject *)inst.super_handle.m_ptr)->ob_refcnt = (Py_ssize_t)_src;
    goto LAB_0026459d;
  case automatic_reference:
  case reference:
    ((PyObject *)inst.super_handle.m_ptr)->ob_refcnt = (Py_ssize_t)_src;
    bVar1 = this->field_0x30 & 0xfe;
    goto LAB_002645a3;
  case copy:
    if (type_name.field_2._8_8_ == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,
                 *(char **)(tinfo->cpptype + 8) + (**(char **)(tinfo->cpptype + 8) == '*'),
                 (allocator<char> *)&local_60);
      clean_type_id((string *)local_88);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b0,"return_value_policy = copy, but type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_60 = (long *)*plVar5;
      plVar7 = plVar5 + 2;
      if (local_60 == plVar7) {
        local_50 = *plVar7;
        lStack_48 = plVar5[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *plVar7;
      }
      local_58 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::runtime_error::runtime_error(prVar4,(string *)&local_60);
      *(undefined ***)prVar4 = &PTR__runtime_error_004c7b68;
      __cxa_throw(prVar4,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar3 = (void *)(*(code *)type_name.field_2._8_8_)(_src);
    break;
  case move:
    uVar6 = local_90;
    if ((local_90 == (_func_void_ptr_void_ptr *)0x0) &&
       (uVar6 = type_name.field_2._8_8_, type_name.field_2._8_8_ == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,
                 *(char **)(tinfo->cpptype + 8) + (**(char **)(tinfo->cpptype + 8) == '*'),
                 (allocator<char> *)&local_60);
      clean_type_id((string *)local_88);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b0,"return_value_policy = move, but type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_60 = (long *)*plVar5;
      plVar7 = plVar5 + 2;
      if (local_60 == plVar7) {
        local_50 = *plVar7;
        lStack_48 = plVar5[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *plVar7;
      }
      local_58 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::runtime_error::runtime_error(prVar4,(string *)&local_60);
      *(undefined ***)prVar4 = &PTR__runtime_error_004c7b68;
      __cxa_throw(prVar4,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar3 = (*(code *)uVar6)(_src);
    break;
  case reference_internal:
    ((PyObject *)inst.super_handle.m_ptr)->ob_refcnt = (Py_ssize_t)_src;
    this->field_0x30 = this->field_0x30 & 0xfe;
    keep_alive_impl(local_40,parent);
    goto LAB_002645a7;
  default:
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"unhandled return_value_policy: should not happen!");
    *(undefined ***)prVar4 = &PTR__runtime_error_004c7b68;
    __cxa_throw(prVar4,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(void **)inst.super_handle.m_ptr = pvVar3;
LAB_0026459d:
  bVar1 = this->field_0x30 | 1;
LAB_002645a3:
  this->field_0x30 = bVar1;
LAB_002645a7:
  (*tinfo->init_instance)(this,existing_holder);
  this_00 = &local_40;
  hVar2.m_ptr = local_40.m_ptr;
LAB_002645b8:
  this_00->m_ptr = (PyObject *)0x0;
  object::~object((object *)this_00);
  return (handle)hVar2.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const detail::type_info *tinfo,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        if (!tinfo) // no type info: error will be set already
            return handle();

        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().release();

        if (handle registered_inst = find_registered_python_instance(src, tinfo))
            return registered_inst;

        auto inst = reinterpret_steal<object>(make_new_instance(tinfo->type));
        auto wrapper = reinterpret_cast<instance *>(inst.ptr());
        wrapper->owned = false;
        void *&valueptr = values_and_holders(wrapper).begin()->value_ptr();

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                valueptr = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                valueptr = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = copy, but type is "
                                     "non-copyable! (compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = copy, but type " +
                                     type_name + " is non-copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    valueptr = move_constructor(src);
                else if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = move, but type is neither "
                                     "movable nor copyable! "
                                     "(compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = move, but type " +
                                     type_name + " is neither movable nor copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                valueptr = src;
                wrapper->owned = false;
                keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_instance(wrapper, existing_holder);

        return inst.release();
    }